

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getBinaryLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  unsigned_long uVar2;
  Exception *this_00;
  
  bVar1 = **(byte **)this;
  if ((bVar1 & 0xf8) == 0xc0) {
    uVar2 = readIntegerNonEmpty<unsigned_long>(*(byte **)this + 1,(ulong)bVar1 - 0xbf);
    return uVar2;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }